

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonFlBitMapTypeValReq::JsonFlBitMapTypeValReq(JsonFlBitMapTypeValReq *this)

{
  undefined8 in_stack_ffffffffffffff28;
  undefined1 allowEmpty;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  allocator local_c9;
  allocator local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  string local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_48;
  
  allowEmpty = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  (this->super_JsonFlBitArrayTypeValReq).super_JsonDtValReq.super_JsonObjValReq.super_JsonValReq.
  _vptr_JsonValReq = (_func_int **)&PTR__JsonObjValReq_0035fd38;
  std::__cxx11::string::string((string *)&local_a0,"fixed-length-bit-map",&local_c9);
  JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonUIntValReq>::shared
            (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40._M_pi,(bool)allowEmpty);
  JsonObjValPropReq::JsonObjValPropReq
            ((JsonObjValPropReq *)&stack0xffffffffffffff48,(Sp *)local_c8,true);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>
            (&local_80,(char **)&strs::flags,(JsonObjValPropReq *)&stack0xffffffffffffff48);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_48,&local_80,&local_48,0,&local_ca,&local_cb,&local_cc);
  JsonFlBitArrayTypeValReq::JsonFlBitArrayTypeValReq
            (&this->super_JsonFlBitArrayTypeValReq,&local_a0,(PropReqs *)&local_48);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_48);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::~pair(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff40);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->super_JsonFlBitArrayTypeValReq).super_JsonDtValReq.super_JsonObjValReq.super_JsonValReq.
  _vptr_JsonValReq = (_func_int **)&PTR__JsonObjValReq_0035fd38;
  return;
}

Assistant:

explicit JsonFlBitMapTypeValReq() :
        JsonFlBitArrayTypeValReq {this->typeStr(), {
            {strs::flags, {
                JsonIntTypeMappingsFlagsValReq<JsonUIntValReq>::shared("flag",
                                                                       "fixed-length bit map type flags",
                                                                       false),
                true,
            }},
        }}
    {
    }